

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool scanImports(Options *options,QSet<QString> *usedDependencies)

{
  QArrayData *pQVar1;
  pointer pQVar2;
  Int IVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  PrivateShared *pPVar6;
  qsizetype qVar7;
  int *piVar8;
  FILE *pFVar9;
  Data *pDVar10;
  Data *pDVar11;
  char16_t *pcVar12;
  undefined8 __stream;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar13;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar14;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar15;
  char cVar16;
  bool bVar17;
  char cVar18;
  int iVar19;
  iterator iVar20;
  iterator iVar21;
  char *pcVar22;
  size_t sVar23;
  iterator iVar24;
  iterator iVar25;
  long lVar26;
  QVariant *pQVar27;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar28;
  uint uVar29;
  QString *qrcFile;
  pointer pQVar30;
  QString *pQVar31;
  long lVar32;
  QChar QVar33;
  QString *import;
  QString *prefix;
  long in_FS_OFFSET;
  QAnyStringView QVar34;
  QLatin1String QVar35;
  QAnyStringView QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QStringView QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QLatin1String QVar42;
  QLatin1String QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QLatin1String QVar47;
  QLatin1String QVar48;
  QFileInfo qmldirFileInfo;
  QFileInfo pluginFileInfo;
  QUrl url;
  QFileInfo info;
  QJsonObject object;
  QJsonArray jsonArray;
  QJsonDocument jsonDocument;
  QFileInfo fileInfo;
  char buffer [512];
  QJsonArray local_4f0 [8];
  QString local_4e8;
  undefined1 *local_4c8;
  QHash<QString,_QHashDummyValue> local_4c0;
  QString local_4b8;
  undefined1 *local_4a0;
  QArrayData *local_498;
  undefined1 *puStack_490;
  undefined1 *local_488;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_478;
  QArrayDataPointer<QtDependency> *pQStack_470;
  QString *local_468;
  QArrayDataPointer<QtDependency> local_458;
  QString local_438;
  undefined1 *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  undefined1 local_3f8 [16];
  QByteArray local_3e8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  QString local_3b8;
  QArrayDataPointer<QString> local_398;
  QString local_378;
  QString local_358;
  QSet<QString> *local_340;
  undefined1 *local_338 [3];
  QArrayDataPointer<QVariant> local_320;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_308;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_300;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_2f8;
  char *local_2f0;
  QDir *local_2e8;
  undefined2 local_2e0;
  QString *local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  QArrayDataPointer<QtDependency> local_2b8;
  QArrayData *local_298;
  undefined1 *puStack_290;
  undefined1 *local_288;
  QArrayData local_278;
  undefined1 *local_268;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_258;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_250;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_248;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_240;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_340 = usedDependencies;
  if (options->verbose == true) {
    fwrite("Scanning for QML imports.\n",0x1a,1,_stdout);
  }
  local_358.d.d = (Data *)0x0;
  local_358.d.ptr = (char16_t *)0x0;
  local_358.d.size = 0;
  if ((options->qmlImportScannerBinaryPath).d.size == 0) {
    local_258.m_data = &options->qtLibExecsDirectory;
    aStack_250 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x11;
    local_248 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x145dfc;
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
              (&local_378,(QStringBuilder<QString_&,_QLatin1String> *)&local_258);
    pDVar11 = local_358.d.d;
    local_358.d.size = local_378.d.size;
    local_358.d.ptr = local_378.d.ptr;
    local_358.d.d = local_378.d.d;
    local_378.d.size = 0;
    local_378.d.d = (Data *)0x0;
    local_378.d.ptr = (char16_t *)0x0;
    if (&pDVar11->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar11->super_QArrayData,2,0x10);
      }
    }
    if (&(local_378.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_378.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    QString::operator=(&local_358,(QString *)&options->qmlImportScannerBinaryPath);
  }
  local_398.d = (Data *)0x0;
  local_398.ptr = (QString *)0x0;
  local_398.size = 0;
  local_3b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_3b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_3b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_258.m_data = &options->qtInstallDirectory;
  local_248.m_data = &options->qtQmlDirectory;
  aStack_250._0_2_ = 0x2f;
  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString_&>::convertTo<QString>
            (&local_3b8,(QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString_&> *)&local_258
            );
  cVar16 = QFile::exists((QString *)&local_3b8);
  if (cVar16 != '\0') {
    shellQuote((QString *)&local_258,&local_3b8);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_398,local_398.size,(QString *)&local_258);
    QList<QString>::end((QList<QString> *)&local_398);
    if ((QArrayData *)local_258.m_data != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_258.m_data = *local_258.m_data + -1;
      UNLOCK();
      if (*local_258.m_data == 0) {
        QArrayData::deallocate((QArrayData *)local_258.m_data,2,0x10);
      }
    }
  }
  aVar28 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
           (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar1 = (QArrayData *)
           (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((QArrayData *)aVar28.m_data != pQVar1) {
    do {
      aStack_300.m_data = &DAT_00000004;
      local_2f8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x145e0e;
      local_308 = aVar28;
      QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
                ((QString *)&local_258,(QStringBuilder<const_QString_&,_QLatin1String> *)&local_308)
      ;
      cVar16 = QFile::exists((QString *)&local_258);
      if ((QArrayData *)local_258.m_data != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_258.m_data = *local_258.m_data + -1;
        UNLOCK();
        if (*local_258.m_data == 0) {
          QArrayData::deallocate((QArrayData *)local_258.m_data,2,0x10);
        }
      }
      if (cVar16 != '\0') {
        local_3c8 = 4;
        local_3c0 = "/qml";
        local_3d0 = aVar28;
        QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
                  ((QString *)&local_308,
                   (QStringBuilder<const_QString_&,_QLatin1String> *)&local_3d0);
        shellQuote((QString *)&local_258,(QString *)&local_308);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_398,local_398.size,(QString *)&local_258);
        QList<QString>::end((QList<QString> *)&local_398);
        if ((QArrayData *)local_258.m_data != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_258.m_data = *local_258.m_data + -1;
          UNLOCK();
          if (*local_258.m_data == 0) {
            QArrayData::deallocate((QArrayData *)local_258.m_data,2,0x10);
          }
        }
        if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_308.m_data = *local_308.m_data + -1;
          UNLOCK();
          if (*local_308.m_data == 0) {
            QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
          }
        }
      }
      aVar28.m_data = &((QArrayData *)((long)aVar28.m_data + 0x10))->alloc;
    } while ((QArrayData *)aVar28.m_data != pQVar1);
  }
  lVar32 = (options->qmlImportPaths).d.size;
  if (lVar32 != 0) {
    pQVar31 = (options->qmlImportPaths).d.ptr;
    lVar32 = lVar32 * 0x18;
    do {
      cVar16 = QFile::exists((QString *)pQVar31);
      if (cVar16 == '\0') {
        scanImports();
      }
      else {
        shellQuote((QString *)&local_258,pQVar31);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_398,local_398.size,(QString *)&local_258);
        QList<QString>::end((QList<QString> *)&local_398);
        if ((QArrayData *)local_258.m_data != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_258.m_data = *local_258.m_data + -1;
          UNLOCK();
          if (*local_258.m_data == 0) {
            QArrayData::deallocate((QArrayData *)local_258.m_data,2,0x10);
          }
        }
      }
      pQVar31 = pQVar31 + 1;
      lVar32 = lVar32 + -0x18;
    } while (lVar32 != 0);
  }
  iVar20 = QList<QString>::begin((QList<QString> *)&local_398);
  iVar21 = QList<QString>::end((QList<QString> *)&local_398);
  if (iVar20.i == iVar21.i) {
LAB_0011e262:
    scanImports();
LAB_0011fb48:
    bVar17 = true;
LAB_0011fb53:
    if (&(local_3b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_3b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_3b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_3b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_3b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_398);
    if (&(local_358.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_358.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return bVar17;
    }
    __stack_chk_fail();
  }
  while( true ) {
    local_258.m_data = (QArrayData *)0x0;
    aStack_250.m_data = (QArrayData *)0x0;
    local_248.m_data = (QArrayData *)0x0;
    QDir::QDir((QDir *)&local_308,(QString *)&local_258);
    cVar16 = QDir::exists((QString *)&local_308);
    QDir::~QDir((QDir *)&local_308);
    if ((QArrayData *)local_258.m_data != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_258.m_data = *local_258.m_data + -1;
      UNLOCK();
      if (*local_258.m_data == 0) {
        QArrayData::deallocate((QArrayData *)local_258.m_data,2,0x10);
      }
    }
    if (cVar16 != '\0') break;
    iVar20.i = iVar20.i + 1;
    if (iVar20.i == iVar21.i) goto LAB_0011e262;
  }
  cVar16 = QFile::exists((QString *)&local_358);
  if (cVar16 == '\0') {
    scanImports();
    goto LAB_0011fb48;
  }
  pQVar30 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
            super__Vector_impl_data._M_start;
  pQVar2 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pQVar30 != pQVar2) {
    do {
      local_308 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(pQVar30->d).d;
      aStack_300 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(pQVar30->d).ptr;
      local_2f8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(pQVar30->d).size;
      if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_308.m_data = *local_308.m_data + 1;
        UNLOCK();
      }
      QFileInfo::QFileInfo((QFileInfo *)&local_3e8,(QString *)&local_308);
      QFileInfo::absoluteFilePath();
      aVar15 = local_248;
      aVar14 = local_258;
      aVar13 = aStack_300;
      aVar28 = local_308;
      local_258.m_data = local_308.m_data;
      local_308 = aVar14;
      aStack_300 = aStack_250;
      aStack_250 = aVar13;
      local_248 = local_2f8;
      local_2f8 = aVar15;
      if ((QArrayData *)aVar28.m_data != (QArrayData *)0x0) {
        LOCK();
        *(int *)aVar28.m_data = *aVar28.m_data + -1;
        UNLOCK();
        if (*aVar28.m_data == 0) {
          QArrayData::deallocate((QArrayData *)aVar28.m_data,2,0x10);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_3e8);
      QVar33.ucs = (char16_t)&local_308;
      cVar16 = QString::endsWith(QVar33,0x2f);
      if (cVar16 == '\0') {
        QString::append(QVar33);
      }
      if ((QArrayData *)local_2f8.m_data != (QArrayData *)0x0) {
        shellQuote((QString *)&local_258,(QString *)&local_308);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_398,local_398.size,(QString *)&local_258);
        QList<QString>::end((QList<QString> *)&local_398);
        if ((QArrayData *)local_258.m_data != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_258.m_data = *local_258.m_data + -1;
          UNLOCK();
          if (*local_258.m_data == 0) {
            QArrayData::deallocate((QArrayData *)local_258.m_data,2,0x10);
          }
        }
      }
      shellQuote(&local_58,(QString *)&local_308);
      local_248.m_data = (void *)(local_58.d.size | 0x8000000000000000);
      local_258._0_1_ = 1;
      aStack_250.m_data_utf16 = local_58.d.ptr;
      local_278.alloc = 0;
      QVar34.m_size = (size_t)" -rootPath %1";
      QVar34.field_0.m_data_utf8 = (char *)&local_3e8;
      local_278._0_8_ = &local_258;
      QtPrivate::argToQString(QVar34,0x400000000000000d,(ArgBase **)0x1);
      QString::append((QString *)&local_358);
      if ((QJsonParseError)local_3e8.d.d != (QJsonParseError)0x0) {
        LOCK();
        *(int *)local_3e8.d.d = *(int *)local_3e8.d.d + -1;
        UNLOCK();
        if (*(int *)local_3e8.d.d == 0) {
          QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)local_58.d.d !=
          (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0) {
        LOCK();
        *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
        UNLOCK();
        if (*(int *)local_58.d.d == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_308.m_data = *local_308.m_data + -1;
        UNLOCK();
        if (*local_308.m_data == 0) {
          QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
        }
      }
      pQVar30 = pQVar30 + 1;
    } while (pQVar30 != pQVar2);
  }
  if ((options->qrcFiles).d.size != 0) {
    QVar35.m_data = (char *)0xa;
    QVar35.m_size = (qsizetype)&local_358;
    QString::append(QVar35);
    iVar20 = QList<QString>::begin(&options->qrcFiles);
    iVar21 = QList<QString>::end(&options->qrcFiles);
    if (iVar20.i != iVar21.i) {
      do {
        shellQuote((QString *)&local_308,iVar20.i);
        local_240 = local_2f8;
        local_248 = aStack_300;
        aStack_250 = local_308;
        local_258._0_2_ = 0x20;
        local_308.m_data = (QArrayData *)0x0;
        aStack_300.m_data = (QArrayData *)0x0;
        local_2f8.m_data = (QArrayData *)0x0;
        operator+=(&local_358,(QStringBuilder<char16_t,_QString> *)&local_258);
        if ((QArrayData *)aStack_250.m_data != (QArrayData *)0x0) {
          LOCK();
          *(int *)aStack_250.m_data = *aStack_250.m_data + -1;
          UNLOCK();
          if (*aStack_250.m_data == 0) {
            QArrayData::deallocate((QArrayData *)aStack_250.m_data,2,0x10);
          }
        }
        if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_308.m_data = *local_308.m_data + -1;
          UNLOCK();
          if (*local_308.m_data == 0) {
            QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
          }
        }
        iVar20.i = iVar20.i + 1;
      } while (iVar20.i != iVar21.i);
    }
  }
  local_258._0_2_ = 0x20;
  QtPrivate::QStringList_join((QList *)&local_3e8,(QChar *)&local_398,(longlong)&local_258);
  local_248.m_data = (void *)(local_3e8.d.size | 0x8000000000000000);
  local_258._0_1_ = 1;
  aStack_250.m_data_utf8 = local_3e8.d.ptr;
  local_58.d.ptr = (char16_t *)0x0;
  QVar36.m_size = (size_t)" -importPath %1";
  QVar36.field_0.m_data_utf8 = (char *)&local_308;
  local_58.d.d = (Data *)&local_258;
  QtPrivate::argToQString(QVar36,0x400000000000000f,(ArgBase **)0x1);
  QString::append((QString *)&local_358);
  if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_308.m_data = *local_308.m_data + -1;
    UNLOCK();
    if (*local_308.m_data == 0) {
      QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
    }
  }
  if ((QJsonParseError)local_3e8.d.d != (QJsonParseError)0x0) {
    LOCK();
    *(int *)local_3e8.d.d = *(int *)local_3e8.d.d + -1;
    UNLOCK();
    if (*(int *)local_3e8.d.d == 0) {
      QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  pFVar9 = _stdout;
  if (options->verbose == true) {
    QString::toLocal8Bit_helper((QChar *)&local_258,(longlong)local_358.d.ptr);
    aVar28 = aStack_250;
    if ((QArrayData *)aStack_250.m_data == (QArrayData *)0x0) {
      aVar28.m_data = &QByteArray::_empty;
    }
    fprintf(pFVar9,"Running qmlimportscanner with the following command: %s\n",aVar28.m_data);
    if ((QArrayData *)local_258.m_data != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_258.m_data = *local_258.m_data + -1;
      UNLOCK();
      if (*local_258.m_data == 0) {
        QArrayData::deallocate((QArrayData *)local_258.m_data,1,0x10);
      }
    }
  }
  local_3f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  openProcess((QString *)(local_3f8 + 8));
  __stream = local_3f8._8_8_;
  if ((FILE *)local_3f8._8_8_ == (FILE *)0x0) {
    scanImports();
    bVar17 = false;
    goto LAB_0011fb53;
  }
  local_3e8.d.d = (Data *)0x0;
  local_3e8.d.ptr = (char *)0x0;
  local_3e8.d.size = 0;
  memset(&local_258,0xaa,0x200);
  pcVar22 = fgets((char *)&local_258,0x200,(FILE *)__stream);
  if (pcVar22 != (char *)0x0) {
    do {
      sVar23 = strlen((char *)&local_258);
      QByteArray::QByteArray((QByteArray *)&local_308,(char *)&local_258,sVar23);
      QByteArray::append(&local_3e8);
      if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_308.m_data = *local_308.m_data + -1;
        UNLOCK();
        if (*local_308.m_data == 0) {
          QArrayData::deallocate((QArrayData *)local_308.m_data,1,0x10);
        }
      }
      pcVar22 = fgets((char *)&local_258,0x200,(FILE *)local_3f8._8_8_);
    } while (pcVar22 != (char *)0x0);
  }
  local_3f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QJsonDocument::fromJson((QByteArray *)local_3f8,(QJsonParseError *)&local_3e8);
  cVar16 = QJsonDocument::isNull();
  if (cVar16 == '\0') {
    local_400 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::array();
    lVar32 = QJsonArray::size();
    if (lVar32 < 1) {
      bVar17 = true;
    }
    else {
      lVar32 = 0;
      do {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QJsonArray::at((longlong)&local_58);
        iVar19 = QJsonValue::type();
        if (iVar19 != 5) {
          scanImports();
          bVar17 = false;
          goto LAB_0011fae1;
        }
        local_408 = &DAT_aaaaaaaaaaaaaaaa;
        QJsonValue::toObject();
        local_268 = &DAT_aaaaaaaaaaaaaaaa;
        local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_278.alloc = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QVar37.m_data = (char *)&local_408;
        QVar37.m_size = (qsizetype)&local_308;
        QJsonObject::value(QVar37);
        QJsonValue::toString();
        QJsonValue::~QJsonValue((QJsonValue *)&local_308);
        pFVar9 = _stderr;
        if (local_268 == (undefined1 *)0x0) {
          QVar41.m_data = (char *)&local_408;
          QVar41.m_size = (qsizetype)&local_2b8;
          QJsonObject::value(QVar41);
          QJsonValue::toString();
          QString::toLocal8Bit_helper((QChar *)&local_308,(longlong)puStack_290);
          aVar28 = aStack_300;
          if ((QArrayData *)aStack_300.m_data == (QArrayData *)0x0) {
            aVar28.m_data = &QByteArray::_empty;
          }
          fprintf(pFVar9,
                  "Warning: QML import could not be resolved in any of the import paths: %s\n",
                  aVar28.m_data);
          if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_308.m_data = *local_308.m_data + -1;
            UNLOCK();
            if (*local_308.m_data == 0) {
              QArrayData::deallocate((QArrayData *)local_308.m_data,1,0x10);
            }
          }
          if (local_298 != (QArrayData *)0x0) {
            LOCK();
            (local_298->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_298->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_298->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_298,2,0x10);
            }
          }
          QJsonValue::~QJsonValue((QJsonValue *)&local_2b8);
LAB_0011f802:
          uVar29 = 0;
        }
        else {
          QVar38.m_data = (char *)&local_408;
          QVar38.m_size = (qsizetype)&local_298;
          QJsonObject::value(QVar38);
          QJsonValue::toString();
          if ((QArrayData *)local_2f8.m_data == (QArrayData *)0x6) {
            QVar39.m_data = (storage_type *)aStack_300.m_data;
            QVar39.m_size = 6;
            QVar48.m_data = "module";
            QVar48.m_size = 6;
            cVar16 = QtPrivate::equalStrings(QVar39,QVar48);
          }
          else {
            cVar16 = '\0';
          }
          if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_308.m_data = *local_308.m_data + -1;
            UNLOCK();
            if (*local_308.m_data == 0) {
              QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
            }
          }
          QJsonValue::~QJsonValue((QJsonValue *)&local_298);
          pFVar9 = _stdout;
          if (cVar16 == '\0') goto LAB_0011f802;
          if (options->verbose == true) {
            QString::toLocal8Bit_helper((QChar *)&local_308,local_278.alloc);
            aVar28 = aStack_300;
            if ((QArrayData *)aStack_300.m_data == (QArrayData *)0x0) {
              aVar28.m_data = &QByteArray::_empty;
            }
            fprintf(pFVar9,"  -- Adding \'%s\' as QML dependency\n",aVar28.m_data);
            if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_308.m_data = *local_308.m_data + -1;
              UNLOCK();
              if (*local_308.m_data == 0) {
                QArrayData::deallocate((QArrayData *)local_308.m_data,1,0x10);
              }
            }
          }
          local_410 = &DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_410,(QString *)&local_278);
          cVar16 = QFileInfo::exists();
          if (cVar16 == '\0') {
            if (options->verbose == true) {
              fwrite("    -- Skipping because path does not exist.\n",0x2d,1,_stdout);
            }
            QFileInfo::~QFileInfo((QFileInfo *)&local_410);
            uVar29 = 0x10;
          }
          else {
            local_288 = &DAT_aaaaaaaaaaaaaaaa;
            local_298 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_290 = &DAT_aaaaaaaaaaaaaaaa;
            QFileInfo::absolutePath();
            cVar16 = QString::endsWith((QChar)(char16_t)(QJsonValue *)&local_298,0x2f);
            if (cVar16 == '\0') {
              QString::append((QChar)(char16_t)&local_298);
            }
            local_418 = &DAT_aaaaaaaaaaaaaaaa;
            QVar40.m_data = (char *)&local_408;
            QVar40.m_size = (qsizetype)&local_2b8;
            QJsonObject::value(QVar40);
            QJsonValue::toString();
            QUrl::QUrl((QUrl *)&local_418,&local_308,0);
            if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_308.m_data = *local_308.m_data + -1;
              UNLOCK();
              if (*local_308.m_data == 0) {
                QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
              }
            }
            QJsonValue::~QJsonValue((QJsonValue *)&local_2b8);
            local_2b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_2b8.d._0_4_ = 0xaaaaaaaa;
            local_2b8.d._4_4_ = 0xaaaaaaaa;
            local_2b8.ptr._0_4_ = 0xaaaaaaaa;
            local_2b8.ptr._4_4_ = 0xaaaaaaaa;
            QUrl::toString(&local_438,&local_418,0);
            local_2f0 = (char *)QString::replace((QChar)(char16_t)&local_438,(QChar)0x2e,0x2f);
            local_308.m_data = (QArrayData *)0x0;
            aStack_300 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x147c44;
            local_2f8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x1;
            QStringBuilder<QString,_QString_&>::convertTo<QString>
                      ((QString *)&local_2b8,(QStringBuilder<QString,_QString_&> *)&local_308);
            if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_308.m_data = *local_308.m_data + -1;
              UNLOCK();
              if (*local_308.m_data == 0) {
                QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
              }
            }
            if (&(local_438.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
              }
            }
            QFileInfo::absolutePath();
            bVar17 = checkCanImportFromRootPaths
                               (options,(QString *)&local_308,(QString *)&local_2b8);
            if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_308.m_data = *local_308.m_data + -1;
              UNLOCK();
              if (*local_308.m_data == 0) {
                QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
              }
            }
            if (bVar17) {
              uVar29 = 0x10;
              if (options->verbose == true) {
                fwrite("    -- Skipping because path is in QML root path.\n",0x32,1,_stdout);
              }
            }
            else {
              local_438.d.d = (Data *)0x0;
              local_438.d.ptr = (char16_t *)0x0;
              local_438.d.size = 0;
              if (local_398.size != 0) {
                lVar26 = local_398.size * 0x18;
                pQVar31 = local_398.ptr;
                do {
                  local_2f8.m_data = &DAT_aaaaaaaaaaaaaaaa;
                  local_308.m_data = &DAT_aaaaaaaaaaaaaaaa;
                  aStack_300.m_data = &DAT_aaaaaaaaaaaaaaaa;
                  QDir::cleanPath((QString *)&local_308);
                  pQStack_470 = &local_2b8;
                  local_478.m_data = &local_308;
                  QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                            ((QString *)&local_458,
                             (QStringBuilder<QString_&,_const_QString_&> *)&local_478);
                  cVar16 = QFile::exists((QString *)&local_458);
                  if (&(local_458.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_458.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_458.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_458.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_458.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (cVar16 != '\0') {
                    QString::operator=(&local_438,(QString *)pQVar31);
                    if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_308.m_data = *local_308.m_data + -1;
                      UNLOCK();
                      if (*local_308.m_data == 0) {
                        QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
                      }
                    }
                    break;
                  }
                  if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
                    LOCK();
                    *(int *)local_308.m_data = *local_308.m_data + -1;
                    UNLOCK();
                    if (*local_308.m_data == 0) {
                      QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
                    }
                  }
                  pQVar31 = pQVar31 + 1;
                  lVar26 = lVar26 + -0x18;
                } while (lVar26 != 0);
              }
              pFVar9 = _stderr;
              if (local_438.d.size == 0) {
                QFileInfo::absoluteFilePath();
                QString::toLocal8Bit_helper((QChar *)&local_308,(longlong)local_458.ptr);
                aVar28 = aStack_300;
                if ((QArrayData *)aStack_300.m_data == (QArrayData *)0x0) {
                  aVar28.m_data = &QByteArray::_empty;
                }
                fprintf(pFVar9,"Import found outside of import paths: %s.\n",aVar28.m_data);
                if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_308.m_data = *local_308.m_data + -1;
                  UNLOCK();
                  if (*local_308.m_data == 0) {
                    QArrayData::deallocate((QArrayData *)local_308.m_data,1,0x10);
                  }
                }
                if (&(local_458.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_458.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_458.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if (((local_458.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_458.d)->super_QArrayData,2,0x10);
                  }
                }
                uVar29 = 1;
              }
              else {
                QDir::QDir((QDir *)&local_498,(QString *)&local_438);
                QDir::absolutePath();
                local_2f8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_468;
                aStack_300 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)pQStack_470;
                local_308 = local_478;
                local_478.m_data = (QArrayData *)0x0;
                pQStack_470 = (QArrayDataPointer<QtDependency> *)0x0;
                local_468 = (QString *)0x0;
                local_2f0 = (char *)CONCAT62(local_2f0._2_6_,0x2f);
                QStringBuilder<QString,_char16_t>::convertTo<QString>
                          ((QString *)&local_458,(QStringBuilder<QString,_char16_t> *)&local_308);
                pcVar12 = local_438.d.ptr;
                pDVar11 = local_438.d.d;
                qVar7 = local_458.size;
                pDVar10 = local_458.d;
                local_458.d = (Data *)local_438.d.d;
                local_438.d.d = (Data *)pDVar10;
                local_438.d.ptr = (char16_t *)local_458.ptr;
                local_458.ptr = (QtDependency *)pcVar12;
                local_458.size = local_438.d.size;
                local_438.d.size = qVar7;
                if (&pDVar11->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                  {
                    QArrayData::deallocate(&pDVar11->super_QArrayData,2,0x10);
                  }
                }
                aVar28 = local_308;
                if ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)local_308.m_data !=
                    (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0) {
                  LOCK();
                  *(int *)local_308.m_data = *local_308.m_data + -1;
                  UNLOCK();
                  if (*aVar28.m_data == 0) {
                    QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
                  }
                }
                if ((QArrayData *)local_478.m_data != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_478.m_data = *local_478.m_data + -1;
                  UNLOCK();
                  if (*local_478.m_data == 0) {
                    QArrayData::deallocate((QArrayData *)local_478.m_data,2,0x10);
                  }
                }
                QDir::~QDir((QDir *)&local_498);
                local_458.d = (Data *)0x0;
                local_458.ptr = (QtDependency *)0x0;
                local_458.size = 0;
                local_478.m_data = &local_340;
                local_468 = &local_438;
                local_488 = &DAT_aaaaaaaaaaaaaaaa;
                local_498 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                puStack_490 = &DAT_aaaaaaaaaaaaaaaa;
                QVar42.m_data = (char *)&local_408;
                QVar42.m_size = (qsizetype)&local_308;
                pQStack_470 = &local_458;
                QJsonObject::value(QVar42);
                QJsonValue::toString();
                QJsonValue::~QJsonValue((QJsonValue *)&local_308);
                QVar43.m_data = (char *)&local_408;
                QVar43.m_size = (qsizetype)&local_308;
                QJsonObject::value(QVar43);
                cVar16 = QJsonValue::toBool(SUB81(&local_308,0));
                QJsonValue::~QJsonValue((QJsonValue *)&local_308);
                local_4a0 = &DAT_aaaaaaaaaaaaaaaa;
                local_308.m_data = &local_278;
                aStack_300._0_2_ = 0x2f;
                local_2f8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x3;
                local_2f0 = "lib";
                local_2e0 = 0x5f;
                local_2d0 = 3;
                local_2c8 = ".so";
                local_2e8 = (QDir *)&local_498;
                local_2d8 = &options->currentArchitecture;
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                ::convertTo<QString>
                          (&local_4b8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                            *)&local_308);
                QFileInfo::QFileInfo((QFileInfo *)&local_4a0,(QString *)&local_4b8);
                if (&(local_4b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_4b8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                local_4b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_4b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_4b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QFileInfo::absoluteFilePath();
                local_4c0.d = (Data *)0x0;
                cVar18 = QFileInfo::exists();
                if (((cVar18 == '\0') || (bVar17 = checkArchitecture(options,&local_4b8), !bVar17))
                   || (bVar17 = readDependenciesFromElf
                                          (options,&local_4b8,local_340,(QSet<QString> *)&local_4c0)
                      , !bVar17)) {
                  if (cVar16 != '\0') goto LAB_0011f2e6;
                  uVar29 = 0x10;
                  if (options->verbose == true) {
                    fwrite("    -- Skipping because the required plugin is missing.\n",0x38,1,
                           _stdout);
                  }
                }
                else {
                  scanImports::anon_class_24_3_0a0102aa::operator()
                            ((anon_class_24_3_0a0102aa *)&local_478,&local_4b8);
LAB_0011f2e6:
                  local_4c8 = &DAT_aaaaaaaaaaaaaaaa;
                  local_308.m_data = &local_278;
                  aStack_300._0_2_ = 0x2f;
                  local_2f8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x6;
                  local_2f0 = "qmldir";
                  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>::
                  convertTo<QString>(&local_4e8,
                                     (QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>
                                      *)&local_308);
                  QFileInfo::QFileInfo((QFileInfo *)&local_4c8,(QString *)&local_4e8);
                  if (&(local_4e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_4e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_4e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_4e8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  cVar16 = QFileInfo::exists();
                  if (cVar16 != '\0') {
                    QFileInfo::absoluteFilePath();
                    scanImports::anon_class_24_3_0a0102aa::operator()
                              ((anon_class_24_3_0a0102aa *)&local_478,(QString *)&local_308);
                    if ((QArrayData *)local_308.m_data != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_308.m_data = *local_308.m_data + -1;
                      UNLOCK();
                      if (*local_308.m_data == 0) {
                        QArrayData::deallocate((QArrayData *)local_308.m_data,2,0x10);
                      }
                    }
                  }
                  local_4e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_4e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_4e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  QVar44.m_data = (char *)&local_408;
                  QVar44.m_size = (qsizetype)&local_308;
                  QJsonObject::value(QVar44);
                  QJsonValue::toString();
                  QJsonValue::~QJsonValue((QJsonValue *)&local_308);
                  QVar45.m_data = (char *)0x2;
                  QVar45.m_size = (qsizetype)&local_4e8;
                  cVar16 = QString::startsWith(QVar45,0x146110);
                  if (cVar16 == '\0') {
                    local_2f8.m_data = &DAT_aaaaaaaaaaaaaaaa;
                    local_308.m_data = &DAT_aaaaaaaaaaaaaaaa;
                    aStack_300.m_data = &DAT_aaaaaaaaaaaaaaaa;
                    QVar46.m_data = (char *)&local_408;
                    QVar46.m_size = (qsizetype)&local_320;
                    QJsonObject::value(QVar46);
                    QJsonValue::toArray();
                    QJsonArray::toVariantList();
                    QJsonArray::~QJsonArray((QJsonArray *)local_338);
                    QJsonValue::~QJsonValue((QJsonValue *)&local_320);
                    QVar47.m_data = (char *)&local_408;
                    QVar47.m_size = (qsizetype)local_338;
                    QJsonObject::value(QVar47);
                    QJsonValue::toArray();
                    QJsonArray::toVariantList();
                    if (local_320.size != 0) {
                      if ((&(local_320.d)->super_QArrayData == (QArrayData *)0x0) ||
                         (1 < ((local_320.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i)) {
                        QtPrivate::QCommonArrayOps<QVariant>::growAppend
                                  ((QCommonArrayOps<QVariant> *)&local_308,local_320.ptr,
                                   local_320.ptr + local_320.size);
                      }
                      else {
                        QArrayDataPointer<QVariant>::detachAndGrow
                                  ((QArrayDataPointer<QVariant> *)&local_308,GrowsAtEnd,
                                   local_320.size,(QVariant **)0x0,
                                   (QArrayDataPointer<QVariant> *)0x0);
                        if ((local_320.size != 0) && (pQVar27 = local_320.ptr, 0 < local_320.size))
                        {
                          do {
                            pPVar6 = (pQVar27->d).data.shared;
                            qVar7 = *(qsizetype *)((long)&(pQVar27->d).data + 8);
                            IVar3 = *(Int *)((long)&(pQVar27->d).data + 0x14);
                            uVar4 = *(undefined4 *)&(pQVar27->d).field_0x18;
                            uVar5 = *(undefined4 *)&(pQVar27->d).field_0x1c;
                            pQVar1 = (QArrayData *)
                                     ((long)aStack_300.m_data +
                                     ((long)local_2f8.m_data * 2 + 1) * 0x10);
                            (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                                 *(__int_type *)((long)&(pQVar27->d).data + 0x10);
                            (pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                            super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar3;
                            *(undefined4 *)&pQVar1->alloc = uVar4;
                            *(undefined4 *)((long)&pQVar1->alloc + 4) = uVar5;
                            pQVar1 = (QArrayData *)
                                     ((long)aStack_300.m_data + (long)local_2f8.m_data * 0x20);
                            *(PrivateShared **)pQVar1 = pPVar6;
                            pQVar1->alloc = qVar7;
                            (pQVar27->d).data.shared = (PrivateShared *)0x0;
                            *(undefined8 *)((long)&(pQVar27->d).data + 8) = 0;
                            *(undefined8 *)((long)&(pQVar27->d).data + 0x10) = 0;
                            *(undefined8 *)&(pQVar27->d).field_0x18 = 2;
                            pQVar27 = pQVar27 + 1;
                            local_2f8.m_data = local_2f8.m_data + 1;
                          } while (pQVar27 < local_320.ptr + local_320.size);
                        }
                      }
                    }
                    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_320);
                    QJsonArray::~QJsonArray(local_4f0);
                    QJsonValue::~QJsonValue((QJsonValue *)local_338);
                    iVar24 = QList<QVariant>::begin((QList<QVariant> *)&local_308);
                    iVar25 = QList<QVariant>::end((QList<QVariant> *)&local_308);
                    for (; iVar24.i != iVar25.i; iVar24.i = iVar24.i + 1) {
                      local_338[0] = &DAT_aaaaaaaaaaaaaaaa;
                      QVariant::toString();
                      QFileInfo::QFileInfo((QFileInfo *)local_338,(QString *)&local_320);
                      if (&(local_320.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_320.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_320.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_320.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                            ._M_i == 0) {
                          QArrayData::deallocate(&(local_320.d)->super_QArrayData,2,0x10);
                        }
                      }
                      cVar16 = QFileInfo::exists();
                      if (cVar16 == '\0') {
                        QFileInfo::~QFileInfo((QFileInfo *)local_338);
                        if (options->verbose != false) {
                          fwrite("    -- Skipping because the required qml files are missing.\n",
                                 0x3c,1,_stdout);
                        }
                        QArrayDataPointer<QVariant>::~QArrayDataPointer
                                  ((QArrayDataPointer<QVariant> *)&local_308);
                        uVar29 = 0x10;
                        goto LAB_0011f69a;
                      }
                      QFileInfo::absoluteFilePath();
                      scanImports::anon_class_24_3_0a0102aa::operator()
                                ((anon_class_24_3_0a0102aa *)&local_478,(QString *)&local_320);
                      if (&(local_320.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_320.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_320.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_320.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                            ._M_i == 0) {
                          QArrayData::deallocate(&(local_320.d)->super_QArrayData,2,0x10);
                        }
                      }
                      QFileInfo::~QFileInfo((QFileInfo *)local_338);
                    }
                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                              ((QArrayDataPointer<QVariant> *)&local_308);
                  }
                  QHash<QString,QList<QtDependency>>::tryEmplace_impl<QString_const&>
                            ((TryEmplaceResult *)&local_308,&options->qtDependencies,
                             &options->currentArchitecture);
                  QtPrivate::QCommonArrayOps<QtDependency>::growAppend
                            ((QCommonArrayOps<QtDependency> *)
                             (*(long *)(*(long *)((long)local_308.m_data + 0x20) +
                                       (((ulong)aStack_300.m_data >> 7) * 0x48 + 0x40) * 2) +
                              (ulong)((uint)*(byte *)(*(long *)((long)local_308.m_data + 0x20) +
                                                     (ulong)(aStack_300._0_4_ & 0x7f) +
                                                     ((ulong)aStack_300.m_data >> 7) * 0x90) * 0x30)
                             + 0x18),local_458.ptr,local_458.ptr + local_458.size);
                  uVar29 = 0;
LAB_0011f69a:
                  if (&(local_4e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_4e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_4e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_4e8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QFileInfo::~QFileInfo((QFileInfo *)&local_4c8);
                }
                QHash<QString,_QHashDummyValue>::~QHash(&local_4c0);
                if (&(local_4b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_4b8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QFileInfo::~QFileInfo((QFileInfo *)&local_4a0);
                if (local_498 != (QArrayData *)0x0) {
                  LOCK();
                  (local_498->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_498->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_498->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_498,2,0x10);
                  }
                }
                QArrayDataPointer<QtDependency>::~QArrayDataPointer(&local_458);
              }
              if (&(local_438.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            piVar8 = (int *)CONCAT44(local_2b8.d._4_4_,local_2b8.d._0_4_);
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if (*piVar8 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_2b8.d._4_4_,local_2b8.d._0_4_),2,0x10);
              }
            }
            QUrl::~QUrl((QUrl *)&local_418);
            if (local_298 != (QArrayData *)0x0) {
              LOCK();
              (local_298->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_298->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_298->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_298,2,0x10);
              }
            }
            QFileInfo::~QFileInfo((QFileInfo *)&local_410);
            if (uVar29 == 0) goto LAB_0011f802;
          }
        }
        if ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)local_278._0_8_ !=
            (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)0x0) {
          LOCK();
          *(int *)local_278._0_8_ = *(int *)local_278._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_278._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
          }
        }
        QJsonObject::~QJsonObject((QJsonObject *)&local_408);
        QJsonValue::~QJsonValue((QJsonValue *)&local_58);
        if ((uVar29 & 0xf) != 0) goto LAB_0011fad7;
        lVar32 = lVar32 + 1;
        lVar26 = QJsonArray::size();
      } while (lVar32 < lVar26);
      uVar29 = 0xe;
LAB_0011fad7:
      bVar17 = uVar29 == 0xe;
    }
LAB_0011fae1:
    QJsonArray::~QJsonArray((QJsonArray *)&local_400);
  }
  else {
    scanImports();
    bVar17 = false;
  }
  QJsonDocument::~QJsonDocument((QJsonDocument *)local_3f8);
  if ((QJsonParseError)local_3e8.d.d != (QJsonParseError)0x0) {
    LOCK();
    *(int *)local_3e8.d.d = *(int *)local_3e8.d.d + -1;
    UNLOCK();
    if (*(int *)local_3e8.d.d == 0) {
      QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((FILE *)local_3f8._8_8_ != (FILE *)0x0) {
    pclose((FILE *)local_3f8._8_8_);
  }
  goto LAB_0011fb53;
}

Assistant:

bool scanImports(Options *options, QSet<QString> *usedDependencies)
{
    if (options->verbose)
        fprintf(stdout, "Scanning for QML imports.\n");

    QString qmlImportScanner;
    if (!options->qmlImportScannerBinaryPath.isEmpty()) {
        qmlImportScanner = options->qmlImportScannerBinaryPath;
    } else {
        qmlImportScanner = execSuffixAppended(options->qtLibExecsDirectory +
                                              "/qmlimportscanner"_L1);
    }

    QStringList importPaths;

    // In Conan's case, qtInstallDirectory will point only to qtbase installed files, which
    // lacks a qml directory. We don't want to pass it as an import path if it doesn't exist
    // because it will cause qmlimportscanner to fail.
    // This also covers the case when only qtbase is installed in a regular Qt build.
    const QString mainImportPath = options->qtInstallDirectory + u'/' + options->qtQmlDirectory;
    if (QFile::exists(mainImportPath))
        importPaths += shellQuote(mainImportPath);

    // These are usually provided by CMake in the deployment json file from paths specified
    // in CMAKE_FIND_ROOT_PATH. They might not have qml modules.
    for (const QString &prefix : options->extraPrefixDirs)
        if (QFile::exists(prefix + "/qml"_L1))
            importPaths += shellQuote(prefix + "/qml"_L1);

    // These are provided by both CMake and qmake.
    for (const QString &qmlImportPath : std::as_const(options->qmlImportPaths)) {
        if (QFile::exists(qmlImportPath)) {
            importPaths += shellQuote(qmlImportPath);
        } else {
            fprintf(stderr, "Warning: QML import path %s does not exist.\n",
                    qPrintable(qmlImportPath));
        }
    }

    bool qmlImportExists = false;

    for (const QString &import : importPaths) {
        if (QDir().exists(import)) {
            qmlImportExists = true;
            break;
        }
    }

    // Check importPaths without rootPath, since we need at least one qml plugins
    // folder to run a QML file
    if (!qmlImportExists) {
        fprintf(stderr, "Warning: no 'qml' directory found under Qt install directory "
                "or import paths. Skipping QML dependency scanning.\n");
        return true;
    }

    if (!QFile::exists(qmlImportScanner)) {
        fprintf(stderr, "%s: qmlimportscanner not found at %s\n",
                qmlImportExists ? "Error"_L1.data() : "Warning"_L1.data(),
                qPrintable(qmlImportScanner));
        return true;
    }

    for (auto rootPath : options->rootPaths) {
        rootPath = QFileInfo(rootPath).absoluteFilePath();

        if (!rootPath.endsWith(u'/'))
            rootPath += u'/';

        // After checking for qml folder imports we can add rootPath
        if (!rootPath.isEmpty())
            importPaths += shellQuote(rootPath);

        qmlImportScanner += " -rootPath %1"_L1.arg(shellQuote(rootPath));
    }

    if (!options->qrcFiles.isEmpty()) {
        qmlImportScanner += " -qrcFiles"_L1;
        for (const QString &qrcFile : options->qrcFiles)
            qmlImportScanner += u' ' + shellQuote(qrcFile);
    }

    qmlImportScanner += " -importPath %1"_L1.arg(importPaths.join(u' '));

    if (options->verbose) {
        fprintf(stdout, "Running qmlimportscanner with the following command: %s\n",
            qmlImportScanner.toLocal8Bit().constData());
    }

    auto qmlImportScannerCommand = openProcess(qmlImportScanner);
    if (qmlImportScannerCommand == 0) {
        fprintf(stderr, "Couldn't run qmlimportscanner.\n");
        return false;
    }

    QByteArray output;
    char buffer[512];
    while (fgets(buffer, sizeof(buffer), qmlImportScannerCommand.get()) != nullptr)
        output += QByteArray(buffer, qstrlen(buffer));

    QJsonDocument jsonDocument = QJsonDocument::fromJson(output);
    if (jsonDocument.isNull()) {
        fprintf(stderr, "Invalid json output from qmlimportscanner.\n");
        return false;
    }

    QJsonArray jsonArray = jsonDocument.array();
    for (int i=0; i<jsonArray.count(); ++i) {
        QJsonValue value = jsonArray.at(i);
        if (!value.isObject()) {
            fprintf(stderr, "Invalid format of qmlimportscanner output.\n");
            return false;
        }

        QJsonObject object = value.toObject();
        QString path = object.value("path"_L1).toString();
        if (path.isEmpty()) {
            fprintf(stderr, "Warning: QML import could not be resolved in any of the import paths: %s\n",
                    qPrintable(object.value("name"_L1).toString()));
        } else if (object.value("type"_L1).toString() == "module"_L1) {
            if (options->verbose)
                fprintf(stdout, "  -- Adding '%s' as QML dependency\n", qPrintable(path));

            QFileInfo info(path);

            // The qmlimportscanner sometimes outputs paths that do not exist.
            if (!info.exists()) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because path does not exist.\n");
                continue;
            }

            QString absolutePath = info.absolutePath();
            if (!absolutePath.endsWith(u'/'))
                absolutePath += u'/';

            const QUrl url(object.value("name"_L1).toString());

            const QString moduleUrlPath = u"/"_s + url.toString().replace(u'.', u'/');
            if (checkCanImportFromRootPaths(options, info.absolutePath(), moduleUrlPath)) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because path is in QML root path.\n");
                continue;
            }

            QString importPathOfThisImport;
            for (const QString &importPath : std::as_const(importPaths)) {
                QString cleanImportPath = QDir::cleanPath(importPath);
                if (QFile::exists(cleanImportPath + moduleUrlPath)) {
                    importPathOfThisImport = importPath;
                    break;
                }
            }

            if (importPathOfThisImport.isEmpty()) {
                fprintf(stderr, "Import found outside of import paths: %s.\n", qPrintable(info.absoluteFilePath()));
                return false;
            }

            importPathOfThisImport = QDir(importPathOfThisImport).absolutePath() + u'/';
            QList<QtDependency> qmlImportsDependencies;
            auto collectQmlDependency = [&usedDependencies, &qmlImportsDependencies,
                                         &importPathOfThisImport](const QString &filePath) {
                if (!usedDependencies->contains(filePath)) {
                    usedDependencies->insert(filePath);
                    qmlImportsDependencies += QtDependency(
                            "qml/"_L1 + filePath.mid(importPathOfThisImport.size()),
                            filePath);
                }
            };

            QString plugin = object.value("plugin"_L1).toString();
            bool pluginIsOptional = object.value("pluginIsOptional"_L1).toBool();
            QFileInfo pluginFileInfo = QFileInfo(
                    path + u'/' + "lib"_L1 + plugin + u'_'
                    + options->currentArchitecture + ".so"_L1);
            QString pluginFilePath = pluginFileInfo.absoluteFilePath();
            QSet<QString> remainingDependencies;
            if (pluginFileInfo.exists() && checkArchitecture(*options, pluginFilePath)
                && readDependenciesFromElf(options, pluginFilePath, usedDependencies,
                                           &remainingDependencies)) {
                collectQmlDependency(pluginFilePath);
            } else if (!pluginIsOptional) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because the required plugin is missing.\n");
                continue;
            }

            QFileInfo qmldirFileInfo = QFileInfo(path + u'/' + "qmldir"_L1);
            if (qmldirFileInfo.exists()) {
                collectQmlDependency(qmldirFileInfo.absoluteFilePath());
            }

            QString prefer = object.value("prefer"_L1).toString();
            // If the preferred location of Qml files points to the Qt resources, this means
            // that all Qml files has been embedded into plugin and we should not copy them to the
            // android rcc bundle
            if (!prefer.startsWith(":/"_L1)) {
                QVariantList qmlFiles =
                        object.value("components"_L1).toArray().toVariantList();
                qmlFiles.append(object.value("scripts"_L1).toArray().toVariantList());
                bool qmlFilesMissing = false;
                for (const auto &qmlFileEntry : qmlFiles) {
                    QFileInfo fileInfo(qmlFileEntry.toString());
                    if (!fileInfo.exists()) {
                        qmlFilesMissing = true;
                        break;
                    }
                    collectQmlDependency(fileInfo.absoluteFilePath());
                }

                if (qmlFilesMissing) {
                    if (options->verbose)
                        fprintf(stdout,
                                "    -- Skipping because the required qml files are missing.\n");
                    continue;
                }
            }

            options->qtDependencies[options->currentArchitecture].append(qmlImportsDependencies);
        } else {
            // We don't need to handle file and directory imports. Generally those should be
            // considered as part of the application and are therefore scanned separately.
        }
    }

    return true;
}